

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extradata.cpp
# Opt level: O0

void __thiscall icu_63::ExtraData::writeExtraData(ExtraData *this,UChar32 c,Norm *norm)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  Norm *norm_local;
  UChar32 c_local;
  ExtraData *this_local;
  
  switch(norm->type) {
  case INERT:
    break;
  case YES_YES_COMBINES_FWD:
    iVar3 = UnicodeString::length(&this->yesYesCompositions);
    norm->offset = iVar3;
    writeCompositions(this,c,norm,&this->yesYesCompositions);
    break;
  case YES_NO_COMBINES_FWD:
    iVar3 = UnicodeString::length(&this->yesNoMappingsAndCompositions);
    iVar2 = writeMapping(this,c,norm,&this->yesNoMappingsAndCompositions);
    norm->offset = iVar3 + iVar2;
    writeCompositions(this,c,norm,&this->yesNoMappingsAndCompositions);
    break;
  case YES_NO_MAPPING_ONLY:
    iVar3 = UnicodeString::length(&this->yesNoMappingsOnly);
    iVar2 = writeMapping(this,c,norm,&this->yesNoMappingsOnly);
    norm->offset = iVar3 + iVar2;
    break;
  case NO_NO_COMP_YES:
    if ((this->optimizeFast != '\0') || (UVar1 = setNoNoDelta(this,c,norm), UVar1 == '\0')) {
      iVar3 = writeNoNoMapping(this,c,norm,&this->noNoMappingsCompYes,
                               &this->previousNoNoMappingsCompYes);
      norm->offset = iVar3;
    }
    break;
  case NO_NO_COMP_BOUNDARY_BEFORE:
    if ((this->optimizeFast != '\0') || (UVar1 = setNoNoDelta(this,c,norm), UVar1 == '\0')) {
      iVar3 = writeNoNoMapping(this,c,norm,&this->noNoMappingsCompBoundaryBefore,
                               &this->previousNoNoMappingsCompBoundaryBefore);
      norm->offset = iVar3;
    }
    break;
  case NO_NO_COMP_NO_MAYBE_CC:
    iVar3 = writeNoNoMapping(this,c,norm,&this->noNoMappingsCompNoMaybeCC,
                             &this->previousNoNoMappingsCompNoMaybeCC);
    norm->offset = iVar3;
    break;
  case NO_NO_EMPTY:
    iVar3 = writeNoNoMapping(this,c,norm,&this->noNoMappingsEmpty,&this->previousNoNoMappingsEmpty);
    norm->offset = iVar3;
    break;
  default:
    exit(5);
  case MAYBE_YES_COMBINES_FWD:
    iVar3 = UnicodeString::length(&this->maybeYesCompositions);
    norm->offset = iVar3;
    writeCompositions(this,c,norm,&this->maybeYesCompositions);
    break;
  case MAYBE_YES_SIMPLE:
    break;
  case YES_YES_WITH_CC:
  }
  return;
}

Assistant:

void ExtraData::writeExtraData(UChar32 c, Norm &norm) {
    switch(norm.type) {
    case Norm::INERT:
        break;  // no extra data
    case Norm::YES_YES_COMBINES_FWD:
        norm.offset=yesYesCompositions.length();
        writeCompositions(c, norm, yesYesCompositions);
        break;
    case Norm::YES_NO_COMBINES_FWD:
        norm.offset=yesNoMappingsAndCompositions.length()+
                writeMapping(c, norm, yesNoMappingsAndCompositions);
        writeCompositions(c, norm, yesNoMappingsAndCompositions);
        break;
    case Norm::YES_NO_MAPPING_ONLY:
        norm.offset=yesNoMappingsOnly.length()+
                writeMapping(c, norm, yesNoMappingsOnly);
        break;
    case Norm::NO_NO_COMP_YES:
        if(!optimizeFast && setNoNoDelta(c, norm)) {
            break;
        }
        norm.offset=writeNoNoMapping(c, norm, noNoMappingsCompYes, previousNoNoMappingsCompYes);
        break;
    case Norm::NO_NO_COMP_BOUNDARY_BEFORE:
        if(!optimizeFast && setNoNoDelta(c, norm)) {
            break;
        }
        norm.offset=writeNoNoMapping(
            c, norm, noNoMappingsCompBoundaryBefore, previousNoNoMappingsCompBoundaryBefore);
        break;
    case Norm::NO_NO_COMP_NO_MAYBE_CC:
        norm.offset=writeNoNoMapping(
            c, norm, noNoMappingsCompNoMaybeCC, previousNoNoMappingsCompNoMaybeCC);
        break;
    case Norm::NO_NO_EMPTY:
        // There can be multiple extra data entries for mappings to the empty string
        // if they have different raw mappings.
        norm.offset=writeNoNoMapping(c, norm, noNoMappingsEmpty, previousNoNoMappingsEmpty);
        break;
    case Norm::MAYBE_YES_COMBINES_FWD:
        norm.offset=maybeYesCompositions.length();
        writeCompositions(c, norm, maybeYesCompositions);
        break;
    case Norm::MAYBE_YES_SIMPLE:
        break;  // no extra data
    case Norm::YES_YES_WITH_CC:
        break;  // no extra data
    default:  // Should not occur.
        exit(U_INTERNAL_PROGRAM_ERROR);
    }
}